

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistatstest.cpp
# Opt level: O0

void test_statisticstracker(void)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  double dVar5;
  string local_d70 [32];
  stringstream local_d50 [8];
  stringstream msg_6;
  ostream local_d40 [376];
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  undefined1 local_b79;
  string local_b78 [32];
  stringstream local_b58 [8];
  stringstream msg_5;
  ostream local_b48 [383];
  undefined1 local_9c9;
  string local_9c8 [32];
  stringstream local_9a8 [8];
  stringstream msg_4;
  ostream local_998 [376];
  string local_820;
  undefined1 local_7f9;
  string local_7f8 [32];
  stringstream local_7d8 [8];
  stringstream msg_3;
  ostream local_7c8 [383];
  undefined1 local_649;
  string local_648 [32];
  stringstream local_628 [8];
  stringstream msg_2;
  ostream local_618 [383];
  undefined1 local_499;
  string local_498 [32];
  stringstream local_478 [8];
  stringstream msg_1;
  ostream local_468 [383];
  undefined1 local_2e9;
  string local_2e8 [32];
  stringstream local_2c8 [8];
  stringstream msg;
  ostream local_2b8 [399];
  allocator<char> local_129;
  string local_128;
  undefined1 local_108 [8];
  StatisticsTracker tracker;
  StatisticsTrackerOptions options;
  
  StatisticsTrackerOptions::StatisticsTrackerOptions
            ((StatisticsTrackerOptions *)((long)&tracker._variance + 4));
  tracker._variance._7_1_ = 1;
  tracker._variance._6_1_ = 1;
  tracker._variance._5_1_ = 1;
  tracker._variance._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"test",&local_129);
  StatisticsTracker::StatisticsTracker
            ((StatisticsTracker *)local_108,&local_128,0,0.0,0.0,0.0,0.0,
             (StatisticsTrackerOptions *)((long)&tracker._variance + 4));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  StatisticsTracker::update((StatisticsTracker *)local_108,1.0);
  StatisticsTracker::update((StatisticsTracker *)local_108,2.0);
  StatisticsTracker::update((StatisticsTracker *)local_108,3.0);
  StatisticsTracker::update((StatisticsTracker *)local_108,4.0);
  StatisticsTracker::update((StatisticsTracker *)local_108,5.0);
  lVar2 = StatisticsTracker::getCount((StatisticsTracker *)local_108);
  if (lVar2 != 5) {
    std::__cxx11::stringstream::stringstream(local_2c8);
    poVar3 = std::operator<<(local_2b8,"StatisticsTracker::getCount failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_2e9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_2e8);
    local_2e9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar5 = StatisticsTracker::getMinimum((StatisticsTracker *)local_108);
  if ((dVar5 != 1.0) || (NAN(dVar5))) {
    std::__cxx11::stringstream::stringstream(local_478);
    poVar3 = std::operator<<(local_468,"StatisticsTracker::getMin failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_499 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_498);
    local_499 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar5 = StatisticsTracker::getMean((StatisticsTracker *)local_108);
  if ((dVar5 != 3.0) || (NAN(dVar5))) {
    std::__cxx11::stringstream::stringstream(local_628);
    poVar3 = std::operator<<(local_618,"StatisticsTracker::getMean failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_649 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_648);
    local_649 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar5 = StatisticsTracker::getMaximum((StatisticsTracker *)local_108);
  if ((dVar5 == 5.0) && (!NAN(dVar5))) {
    StatisticsTracker::getName_abi_cxx11_(&local_820,(StatisticsTracker *)local_108);
    bVar1 = std::operator==(&local_820,"test");
    std::__cxx11::string::~string((string *)&local_820);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_9a8);
      poVar3 = std::operator<<(local_998,"StatisticsTracker::getName failed");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_9c9 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar4,local_9c8);
      local_9c9 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar5 = StatisticsTracker::getVariance((StatisticsTracker *)local_108);
    if ((dVar5 == 2.0) && (!NAN(dVar5))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"test2",&local_ba1);
      StatisticsTracker::setName((StatisticsTracker *)local_108,&local_ba0);
      std::__cxx11::string::~string((string *)&local_ba0);
      std::allocator<char>::~allocator(&local_ba1);
      StatisticsTracker::getName_abi_cxx11_(&local_bc8,(StatisticsTracker *)local_108);
      bVar1 = std::operator==(&local_bc8,"test2");
      std::__cxx11::string::~string((string *)&local_bc8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        StatisticsTracker::~StatisticsTracker((StatisticsTracker *)local_108);
        return;
      }
      std::__cxx11::stringstream::stringstream(local_d50);
      poVar3 = std::operator<<(local_d40,"StatisticsTracker::setName failed");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar4,local_d70);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::stringstream(local_b58);
    poVar3 = std::operator<<(local_b48,"StatisticsTracker::getVariance failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_b79 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_b78);
    local_b79 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_7d8);
  poVar3 = std::operator<<(local_7c8,"StatisticsTracker::getMax failed");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_7f9 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar4,local_7f8);
  local_7f9 = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_statisticstracker()
{

    StatisticsTrackerOptions options;
    options.doCov = options.doMax = options.doMean = options.doMin = options.doVar = true;
    
    StatisticsTracker tracker("test", 0, 0, 0, 0, 0, options);
    tracker.update(1);
    tracker.update(2);
    tracker.update(3);
    tracker.update(4);
    tracker.update(5);

    ASSERT_EQUAL(tracker.getCount(), 5, "StatisticsTracker::getCount failed");
    ASSERT_EQUAL(tracker.getMinimum(), 1, "StatisticsTracker::getMin failed");
    ASSERT_EQUAL(tracker.getMean(), 3, "StatisticsTracker::getMean failed");
    ASSERT_EQUAL(tracker.getMaximum(), 5, "StatisticsTracker::getMax failed");
    ASSERT_EQUAL(tracker.getName(), "test", "StatisticsTracker::getName failed");
    ASSERT_EQUAL(tracker.getVariance(), 2, "StatisticsTracker::getVariance failed");
    
    tracker.setName("test2");
    ASSERT_EQUAL(tracker.getName(), "test2", "StatisticsTracker::setName failed");

}